

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Printer.h
# Opt level: O1

void __thiscall soul::heart::Printer::PrinterStream::printFunction(PrinterStream *this,Function *f)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pool_ref<soul::heart::Variable> *ppVar2;
  pointer ppVar3;
  size_t sVar4;
  char *pcVar5;
  pointer ppVar6;
  CodePrinter *pCVar7;
  bool bVar8;
  string_view text;
  string_view text_00;
  ArrayView<soul::pool_ref<soul::heart::Variable>_> parameters;
  string_view text_01;
  string_view text_02;
  char s [2];
  char local_52 [2];
  string local_50;
  
  if ((f->name).name != (string *)0x0) {
    bVar8 = (f->functionType).type != event;
    pcVar5 = "function ";
    if (!bVar8) {
      pcVar5 = "event ";
    }
    text._M_len = (ulong)bVar8 * 3 + 6;
    text._M_str = pcVar5;
    choc::text::CodePrinter::writeBlock(this->out,text);
    pCVar7 = this->out;
    Program::ProgramImpl::getFunctionNameWithQualificationIfNeeded_abi_cxx11_
              (&local_50,(this->module->program).pimpl,this->module,f);
    text_00._M_str = local_50._M_dataplus._M_p;
    text_00._M_len = local_50._M_string_length;
    choc::text::CodePrinter::writeBlock(pCVar7,text_00);
    paVar1 = &local_50.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                               local_50.field_2._M_allocated_capacity._0_2_) + 1);
    }
    ppVar2 = (f->parameters).items;
    parameters.e = ppVar2 + (f->parameters).numActive;
    parameters.s = ppVar2;
    printParameters(this,parameters);
    if ((f->functionType).type != event) {
      pCVar7 = this->out;
      text_01._M_str = " -> ";
      text_01._M_len = 4;
      choc::text::CodePrinter::writeBlock(pCVar7,text_01);
      getTypeDescription_abi_cxx11_(&local_50,this,&f->returnType);
      text_02._M_str = local_50._M_dataplus._M_p;
      text_02._M_len = local_50._M_string_length;
      choc::text::CodePrinter::writeBlock(pCVar7,text_02);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                                 local_50.field_2._M_allocated_capacity._0_2_) + 1);
      }
    }
    printDescription(this,&f->annotation);
    pCVar7 = this->out;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    if (f->hasNoBody == true) {
      local_52[0] = ';';
      local_52[1] = '\0';
      sVar4 = strlen(local_52);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar4)
      ;
      choc::text::CodePrinter::append(pCVar7,&local_50);
    }
    else {
      local_50.field_2._M_allocated_capacity._0_2_ = 10;
      local_50._M_string_length = 1;
      choc::text::CodePrinter::append(pCVar7,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                                 local_50.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_52[0] = '{';
      local_52[1] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(local_52);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar4)
      ;
      choc::text::CodePrinter::append(pCVar7,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                                 local_50.field_2._M_allocated_capacity._0_2_) + 1);
      }
      local_50.field_2._M_allocated_capacity._0_2_ = 10;
      local_50._M_string_length = 1;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      choc::text::CodePrinter::append(pCVar7,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                                 local_50.field_2._M_allocated_capacity._0_2_) + 1);
      }
      buildLocalVariableList(this,f);
      ppVar3 = (f->blocks).
               super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar6 = (f->blocks).
                    super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar6 != ppVar3; ppVar6 = ppVar6 + 1
          ) {
        printBlock(this,ppVar6->object);
      }
      pCVar7 = this->out;
      local_52[0] = '}';
      local_52[1] = '\0';
      local_50._M_dataplus._M_p = (pointer)paVar1;
      sVar4 = strlen(local_52);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,local_52,local_52 + sVar4)
      ;
      choc::text::CodePrinter::append(pCVar7,&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                               local_50.field_2._M_allocated_capacity._0_2_) + 1);
    }
    choc::text::CodePrinter::operator<<(pCVar7,(BlankLine *)&blankLine);
    return;
  }
  throwInternalCompilerError("f.name.isValid()","printFunction",300);
}

Assistant:

static std::string getDump (const Program& p)
    {
        choc::text::CodePrinter out;
        print (p, out);
        return out.toString();
    }